

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

Polynomial * __thiscall
PolynomialParser::value(Polynomial *__return_storage_ptr__,PolynomialParser *this)

{
  parsePoly(this,0,(int)(this->mString)._M_string_length);
  Polynomial::Polynomial(__return_storage_ptr__,&this->mResult);
  return __return_storage_ptr__;
}

Assistant:

Polynomial value()
  {
    try {
      parsePoly(0, mString.size());
    }
    catch (const std::string& excep) {
      std::cout << "exception: " << excep << std::endl;
    }
      
    return mResult;
  }